

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  ImVec2 *out_b;
  long lVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  ImVec2 IVar4;
  ImDrawIdx *pIVar5;
  ImDrawVert *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 __src [8];
  undefined4 uVar15;
  uint uVar16;
  ImU32 IVar17;
  ImU32 IVar18;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined7 uVar20;
  undefined7 extraout_var_01;
  char *text_end;
  void *pvVar19;
  undefined7 extraout_var_02;
  byte bVar21;
  ImGuiContext *pIVar22;
  uint uVar23;
  ImGuiContext *g;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 size;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  ImVec2 IVar32;
  undefined1 this [8];
  char cVar24;
  int iVar25;
  ImVec2 *pIVar26;
  long lVar27;
  bool bVar28;
  uint uVar29;
  int iVar30;
  float fVar31;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  int iVar35;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  int iVar36;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  float fVar48;
  float V;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 current_off_unrotated;
  float vv;
  ImVec2 picker_pos;
  ImVec2 tra;
  float ww;
  float uu;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_26c;
  float local_268;
  float local_264;
  undefined4 local_260;
  float local_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  ImGuiContext *local_238;
  ImVec2 *local_230;
  float local_224;
  float local_220;
  float local_21c;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  undefined1 local_208 [24];
  ImVec2 local_1f0;
  ImU32 local_1e4;
  uint local_1e0;
  float local_1dc;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  float local_1c8;
  float fStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  ImVec2 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  ImVec2 local_190;
  float local_188;
  float fStack_184;
  uint uStack_180;
  uint uStack_17c;
  ImVec2 local_178;
  float fStack_170;
  float fStack_16c;
  int local_168;
  int local_164;
  uint local_160;
  undefined1 local_158 [8];
  ImVec2 local_150;
  ImVec2 local_148;
  ImU32 local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  ImVec2 local_118;
  ImVec2 local_110;
  undefined1 local_108 [16];
  ImGuiWindow *local_f8;
  ImU32 local_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  ImVec4 local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  size_t local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  uint uStack_80;
  uint uStack_7c;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar38 [16];
  
  pIVar22 = GImGui;
  uStack_1a0 = local_1a8;
  uStack_210 = local_218;
  local_218 = (undefined1  [8])ref_col;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems != false) {
    bVar21 = 0;
    goto LAB_00168b73;
  }
  pIVar3 = pIVar2->DrawList;
  local_258._0_4_ = CalcItemWidth();
  local_258._4_4_ = extraout_XMM0_Db;
  fStack_250 = (float)extraout_XMM0_Dc;
  fStack_24c = (float)extraout_XMM0_Dd;
  local_238 = pIVar22;
  (pIVar22->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar23 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar23);
  }
  pIVar22 = local_238;
  if ((flags & 0x6000000U) == 0) {
    uVar16 = local_238->ColorEditOptions & 0x6000000;
    uVar29 = 0x2000000;
    if (uVar16 != 0) {
      uVar29 = uVar16;
    }
    uVar23 = uVar23 | uVar29;
  }
  if ((uVar23 & 0x18000000) == 0) {
    uVar16 = local_238->ColorEditOptions & 0x18000000;
    uVar29 = 0x8000000;
    if (uVar16 != 0) {
      uVar29 = uVar16;
    }
    uVar23 = uVar23 | uVar29;
  }
  uVar29 = (uVar23 & 0x6000000) - 1;
  if ((uVar23 & 0x6000000 ^ uVar29) <= uVar29) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x130c,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar29 = (uVar23 & 0x18000000) - 1;
  if ((uVar23 & 0x18000000 ^ uVar29) <= uVar29) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x130d,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  local_1a8 = (undefined1  [8])pIVar3;
  if ((uVar23 & 8) == 0) {
    uVar23 = uVar23 | local_238->ColorEditOptions & 0x10000U;
  }
  local_1e0 = uVar23 & 0x10002;
  bVar28 = local_1e0 == 0x10000;
  IVar32 = (pIVar2->DC).CursorPos;
  local_230 = (ImVec2 *)col;
  local_148 = IVar32;
  local_f8 = pIVar2;
  local_188 = GetFrameHeight();
  pIVar26 = local_230;
  fVar43 = (pIVar22->Style).ItemInnerSpacing.x;
  local_128 = ZEXT416((uint)fVar43);
  fVar43 = (float)local_258._0_4_ - (local_188 + fVar43) * (float)(byte)(bVar28 + 1);
  uVar29 = -(uint)(fVar43 <= local_188);
  fStack_1c4 = (float)(local_258._4_4_ & (uint)extraout_XMM0_Db_00);
  uStack_1c0 = (uint)fStack_250 & extraout_XMM0_Dc_00;
  uStack_1bc = (uint)fStack_24c & extraout_XMM0_Dd_00;
  local_1c8 = (float)(uVar29 & (uint)local_188 | ~uVar29 & (uint)fVar43);
  local_a0 = (ulong)((uVar23 & 2) == 0) * 4 + 0xc;
  fStack_184 = extraout_XMM0_Db_00;
  uStack_180 = extraout_XMM0_Dc_00;
  uStack_17c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_230,local_a0);
  local_25c = local_1c8 * 0.08;
  local_98 = ZEXT416((uint)(local_1c8 * 0.5));
  local_1d0.x = local_1c8 * 0.5 - local_25c;
  _local_b8 = ZEXT416((uint)local_1d0.x);
  uStack_1b0 = 0;
  local_1dc = IVar32.x;
  local_88._4_4_ = fStack_1c4;
  local_88._0_4_ = local_1c8 + local_1dc;
  uStack_80 = uStack_1c0;
  uStack_7c = uStack_1bc;
  local_258._4_4_ = local_128._4_4_;
  local_258._0_4_ = (float)local_128._0_4_ + local_1c8 + local_1dc;
  fStack_250 = (float)local_128._8_4_;
  fStack_24c = (float)local_128._12_4_;
  local_e8 = (local_188 + local_1c8) * 0.5 + local_1dc;
  fStack_e4 = local_1c8 * 0.5 + IVar32.y;
  fStack_e0 = fStack_184 * 0.0 + 0.0;
  fStack_dc = fStack_1c4 * 0.0 + 0.0;
  local_1f0.y = fStack_e4;
  local_1f0.x = local_e8;
  local_1d0.x = local_1d0.x - (float)(int)(local_1c8 * 0.027);
  local_190.x = local_1d0.x * -0.5;
  local_190.y = local_1d0.x * -0.866025;
  local_1d0.y = 0.0;
  local_1d8.y = local_1d0.x * 0.866025;
  local_26c = pIVar26->x;
  local_268 = pIVar26->y;
  local_264 = pIVar26[1].x;
  local_224 = local_264;
  local_220 = local_268;
  local_21c = local_26c;
  local_1d8.x = local_190.x;
  local_1b8 = IVar32;
  if ((uVar23 >> 0x1b & 1) == 0) {
    this = local_1a8;
    if ((uVar23 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_26c,local_268,local_264,&local_21c,&local_220,&local_224);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_26c,local_268,local_264,&local_26c,&local_268,&local_264);
    IVar32.x = pIVar22->ColorEditLastColor[0];
    IVar32.y = pIVar22->ColorEditLastColor[1];
    this = local_1a8;
    if (pIVar22->ColorEditLastColor[2] == pIVar26[1].x && IVar32 == *pIVar26) {
      if ((local_268 == 0.0) && (!NAN(local_268))) {
        local_26c = pIVar22->ColorEditLastHue;
      }
      if ((local_264 == 0.0) && (!NAN(local_264))) {
        local_268 = pIVar22->ColorEditLastSat;
      }
    }
  }
  local_248._4_4_ = fStack_184;
  local_248._0_4_ = local_188 + (float)local_258._0_4_;
  fStack_240 = (float)uStack_180;
  fStack_23c = (float)uStack_17c;
  PushItemFlag(8,true);
  if ((uVar23 >> 0x1a & 1) == 0) {
    if ((uVar23 >> 0x19 & 1) == 0) {
      auVar9._12_4_ = 0;
      auVar9._0_12_ = local_138._4_12_;
      local_138 = auVar9 << 0x20;
      local_260 = 0;
      auVar7._12_4_ = 0;
      auVar7._0_12_ = local_208._4_12_;
      local_208._0_16_ = auVar7 << 0x20;
      goto LAB_00167875;
    }
    local_178.y = local_1c8;
    local_178.x = local_1c8;
    auVar10._12_4_ = 0;
    auVar10._0_12_ = local_138._4_12_;
    local_138 = auVar10 << 0x20;
    InvisibleButton("sv",&local_178,0);
    bVar28 = IsItemActive();
    if (bVar28) {
      auVar37._0_4_ = local_1c8 + -1.0;
      IVar32 = (pIVar22->IO).MousePos;
      auVar33._0_4_ = IVar32.x - local_1b8.x;
      auVar33._4_4_ = IVar32.y - local_1b8.y;
      auVar33._8_4_ = 0.0 - (float)uStack_1b0;
      auVar33._12_4_ = 0.0 - uStack_1b0._4_4_;
      auVar37._4_4_ = auVar37._0_4_;
      auVar37._8_4_ = auVar37._0_4_;
      auVar37._12_4_ = auVar37._0_4_;
      auVar34 = divps(auVar33,auVar37);
      fVar43 = auVar34._4_4_;
      iVar25 = -(uint)(1.0 < auVar34._0_4_);
      iVar30 = -(uint)(1.0 < fVar43);
      auVar39._4_4_ = iVar30;
      auVar39._0_4_ = iVar25;
      auVar39._8_4_ = iVar30;
      auVar39._12_4_ = iVar30;
      auVar38._8_8_ = auVar39._8_8_;
      auVar38._4_4_ = iVar25;
      auVar38._0_4_ = iVar25;
      uVar29 = movmskpd((int)CONCAT71(extraout_var,bVar28),auVar38);
      auVar47 = ZEXT816(0x3f800000);
      if ((uVar29 & 1) == 0) {
        auVar47 = auVar34;
      }
      local_268 = (float)(~-(uint)(auVar34._0_4_ < 0.0) & auVar47._0_4_);
      fVar31 = 0.0;
      if ((uVar29 & 2) == 0) {
        fVar31 = 1.0 - fVar43;
      }
      local_264 = (float)(-(uint)(fVar43 < 0.0) & 0x3f800000 | ~-(uint)(fVar43 < 0.0) & (uint)fVar31
                         );
      local_138._0_4_ = (int)CONCAT71((uint7)(uint3)(uVar29 >> 8),1);
    }
    if ((uVar23 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
    local_178.y = local_1b8.y;
    local_178.x = (float)local_258._0_4_;
    SetCursorScreenPos(&local_178);
    local_178.y = local_1c8;
    local_178.x = local_188;
    local_260 = 0;
    InvisibleButton("hue",&local_178,0);
    bVar28 = IsItemActive();
    if (!bVar28) {
      local_208._0_4_ = local_138._0_4_;
      goto LAB_00167875;
    }
    fVar43 = ((pIVar22->IO).MousePos.y - local_1b8.y) / (local_1c8 + -1.0);
    local_26c = 1.0;
    if (fVar43 <= 1.0) {
      local_26c = fVar43;
    }
    local_26c = (float)(~-(uint)(fVar43 < 0.0) & (uint)local_26c);
    local_260 = (undefined4)CONCAT71(extraout_var_00,1);
    local_208._0_4_ = (int)CONCAT71(extraout_var_00,1);
  }
  else {
    local_178.y = local_1c8;
    local_178.x = (pIVar22->Style).ItemInnerSpacing.x + local_1c8 + local_188;
    auVar47._12_4_ = 0;
    auVar47._0_12_ = local_138._4_12_;
    local_138 = auVar47 << 0x20;
    InvisibleButton("hsv",&local_178,0);
    bVar28 = IsItemActive();
    local_260 = 0;
    auVar34._12_4_ = 0;
    auVar34._0_12_ = local_208._4_12_;
    local_208._0_16_ = auVar34 << 0x20;
    if (bVar28) {
      fVar48 = (pIVar22->IO).MouseClickedPos[0].x - local_e8;
      fVar46 = (pIVar22->IO).MouseClickedPos[0].y - fStack_e4;
      fVar31 = (pIVar22->IO).MousePos.x - local_e8;
      local_138 = ZEXT416((uint)fVar31);
      fVar43 = (pIVar22->IO).MousePos.y - fStack_e4;
      local_108 = ZEXT416((uint)fVar43);
      local_c8 = ZEXT416((uint)fVar46);
      local_208._0_16_ = ZEXT416((uint)fVar48);
      fVar46 = fVar48 * fVar48 + fVar46 * fVar46;
      if ((fVar46 < ((float)local_b8._0_4_ + -1.0) * ((float)local_b8._0_4_ + -1.0)) ||
         (((float)local_98._0_4_ + 1.0) * ((float)local_98._0_4_ + 1.0) < fVar46)) {
        local_260 = 0;
      }
      else {
        fVar43 = atan2f(fVar43,fVar31);
        fVar43 = (fVar43 / 3.1415927) * 0.5;
        local_26c = (float)(~-(uint)(fVar43 < 0.0) & (uint)fVar43 |
                           (uint)(fVar43 + 1.0) & -(uint)(fVar43 < 0.0));
        local_260 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_e8 = cosf(local_26c * -2.0 * 3.1415927);
      fStack_e4 = extraout_XMM0_Db_01;
      fStack_e0 = extraout_XMM0_Dc_01;
      fStack_dc = extraout_XMM0_Dd_01;
      fVar43 = sinf(local_26c * -2.0 * 3.1415927);
      fVar31 = -(float)local_c8._0_4_;
      fVar46 = local_e8 * (float)local_c8._0_4_;
      local_c8._4_4_ = extraout_XMM0_Db_02;
      local_c8._0_4_ = fVar43;
      local_c8._8_4_ = extraout_XMM0_Dc_02;
      local_c8._12_4_ = extraout_XMM0_Dd_02;
      local_178.x = local_e8 * (float)local_208._0_4_ + fVar31 * fVar43;
      local_178.y = fVar43 * (float)local_208._0_4_ + fVar46;
      bVar28 = ImTriangleContainsPoint(&local_1d0,&local_190,&local_1d8,&local_178);
      if (bVar28) {
        local_178.x = local_e8 * (float)local_138._0_4_ +
                      -(float)local_108._0_4_ * (float)local_c8._0_4_;
        local_178.y = (float)local_c8._0_4_ * (float)local_138._0_4_ +
                      local_e8 * (float)local_108._0_4_;
        bVar28 = ImTriangleContainsPoint(&local_1d0,&local_190,&local_1d8,&local_178);
        if (!bVar28) {
          local_178 = ImTriangleClosestPoint(&local_1d0,&local_190,&local_1d8,&local_178);
        }
        ImTriangleBarycentricCoords
                  (&local_1d0,&local_190,&local_1d8,&local_178,&local_d8.x,(float *)local_158,
                   &local_110.x);
        fVar31 = 1.0 - (float)local_158._0_4_;
        fVar43 = 1.0;
        if (fVar31 <= 1.0) {
          fVar43 = fVar31;
        }
        local_264 = (float)(-(uint)(fVar31 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar31 < 0.0001) & (uint)fVar43);
        fVar31 = local_d8.x / local_264;
        fVar43 = 1.0;
        if (fVar31 <= 1.0) {
          fVar43 = fVar31;
        }
        local_268 = (float)(-(uint)(fVar31 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar31 < 0.0001) & (uint)fVar43);
        uVar20 = (undefined7)((ulong)extraout_RAX_00 >> 8);
        local_138._0_4_ = (int)CONCAT71(uVar20,1);
        local_208._0_4_ = (int)CONCAT71(uVar20,1);
        pIVar22 = local_238;
        pIVar26 = local_230;
      }
      else {
        auVar8._12_4_ = 0;
        auVar8._0_12_ = local_138._4_12_;
        local_138 = auVar8 << 0x20;
        local_208._0_4_ = local_260;
      }
    }
    if ((uVar23 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
LAB_00167875:
  }
  local_128._0_4_ = (float)local_128._0_4_ + (float)local_248._0_4_;
  if (local_1e0 == 0x10000) {
    local_178.y = local_1b8.y;
    local_178.x = (float)local_128._0_4_;
    SetCursorScreenPos(&local_178);
    local_178.y = local_1c8;
    local_178.x = local_188;
    InvisibleButton("alpha",&local_178,0);
    bVar28 = IsItemActive();
    if (bVar28) {
      fVar31 = ((pIVar22->IO).MousePos.y - local_1b8.y) / (local_1c8 + -1.0);
      fVar43 = 1.0;
      if (fVar31 <= 1.0) {
        fVar43 = fVar31;
      }
      pIVar26[1].y = (float)(-(uint)(fVar31 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar31 < 0.0) & (uint)(1.0 - fVar43));
      local_208._0_4_ = (int)CONCAT71(extraout_var_01,1);
    }
  }
  PopItemFlag();
  if ((uVar23 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar22->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar23) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar23 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar22->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  if ((uVar23 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_178 = *pIVar26;
    fStack_170 = pIVar26[1].x;
    if ((uVar23 & 2) == 0) {
      fStack_16c = pIVar26[1].y;
    }
    else {
      fStack_16c = 1.0;
    }
    __src = local_218;
    if ((char)uVar23 < '\0') {
      Text("Current");
    }
    size.x = local_188 * 3.0;
    size.y = local_188 * 2.0;
    uStack_210._0_4_ = local_188 * 0.0;
    local_218._0_4_ = size.x;
    local_218._4_4_ = size.y;
    uStack_210._4_4_ = local_188 * 0.0;
    ColorButton("##current",(ImVec4 *)&local_178,uVar23 & 0x180e0040,size);
    if (__src != (undefined1  [8])0x0) {
      Text("Original");
      local_d8._0_8_ = *(undefined8 *)__src;
      local_d8.z = *(float *)((long)__src + 8);
      if ((uVar23 & 2) == 0) {
        local_d8.w = *(float *)((long)__src + 0xc);
      }
      else {
        local_d8.w = 1.0;
      }
      bVar28 = ColorButton("##original",&local_d8,uVar23 & 0x180e0040,(ImVec2)local_218);
      if (bVar28) {
        pvVar19 = memcpy(pIVar26,(void *)__src,local_a0);
        local_208._0_4_ = (int)CONCAT71((int7)((ulong)pvVar19 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  fVar43 = local_188 * 0.2;
  fVar31 = 0.0;
  fVar46 = 0.0;
  fVar48 = 0.0;
  out_g = &pIVar26->y;
  out_b = pIVar26 + 1;
  if (((char)local_260 != '\0') || (local_138[0] != '\0')) {
    if ((uVar23 >> 0x1b & 1) == 0) {
      if ((uVar23 >> 0x1c & 1) != 0) {
        pIVar26->x = local_26c;
        pIVar26->y = local_268;
        pIVar26[1].x = local_264;
      }
    }
    else {
      _local_218 = ZEXT416((uint)fVar43);
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_26c) & (uint)local_26c |
                        (uint)(local_26c + -1e-05) & -(uint)(1.0 <= local_26c)),
                 (float)(~-(uint)(0.0 < local_268) & 0x3727c5ac |
                        (uint)local_268 & -(uint)(0.0 < local_268)),
                 (float)(~-(uint)(0.0 < local_264) & 0x358637bd |
                        (uint)local_264 & -(uint)(0.0 < local_264)),&pIVar26->x,out_g,&out_b->x);
      pIVar22->ColorEditLastHue = local_26c;
      pIVar22->ColorEditLastSat = local_268;
      fVar43 = pIVar26->y;
      pIVar22->ColorEditLastColor[0] = pIVar26->x;
      pIVar22->ColorEditLastColor[1] = fVar43;
      pIVar22->ColorEditLastColor[2] = pIVar26[1].x;
      fVar43 = (float)local_218._0_4_;
      fVar31 = (float)local_218._4_4_;
      fVar46 = (float)uStack_210;
      fVar48 = uStack_210._4_4_;
    }
  }
  iVar25 = (int)fVar43;
  iVar30 = (int)fVar31;
  iVar35 = (int)fVar46;
  iVar36 = (int)fVar48;
  if ((uVar23 & 0x20) == 0) {
    local_218._4_4_ = (int)fVar31;
    local_218._0_4_ = (int)fVar43;
    uStack_210._0_4_ = (float)(int)fVar46;
    uStack_210._4_4_ = (float)(int)fVar48;
    fVar43 = (float)local_128._0_4_;
    if (local_1e0 != 0x10000) {
      fVar43 = (float)local_258._0_4_;
    }
    PushItemWidth((fVar43 + local_188) - local_1dc);
    uVar29 = uVar23 & 0x198e001a;
    cVar24 = '\x01';
    if (((uVar23 >> 0x14 & 1) != 0 || (uVar23 & 0x600000) == 0) &&
       (bVar28 = ColorEdit4("##rgb",&local_230->x,uVar29 | 0x100004), bVar28)) {
      local_208._0_4_ = (int)CONCAT71(extraout_var_02,1);
      if (local_238->ActiveId == 0) {
        cVar24 = '\x01';
      }
      else {
        cVar24 = local_238->ActiveIdAllowOverlap;
      }
    }
    if ((uVar23 >> 0x15 & 1) != 0 || (uVar23 & 0x500000) == 0) {
      bVar28 = ColorEdit4("##hsv",&local_230->x,uVar29 | 0x200004);
      auVar47 = local_208._0_16_;
      local_208._1_3_ = local_208._1_3_;
      local_208[0] = local_208[0] | bVar28;
      local_208._4_12_ = auVar47._4_12_;
    }
    if ((uVar23 >> 0x16 & 1) != 0 || (uVar23 & 0x300000) == 0) {
      bVar28 = ColorEdit4("##hex",&local_230->x,uVar29 | 0x400004);
      auVar47 = local_208._0_16_;
      local_208._1_3_ = local_208._1_3_;
      local_208[0] = local_208[0] | bVar28;
      local_208._4_12_ = auVar47._4_12_;
    }
    PopItemWidth();
    pIVar26 = local_230;
    pIVar22 = local_238;
    if ((uVar23 >> 0x1b & 1) != 0 && cVar24 == '\0') {
      ColorConvertRGBtoHSV
                (local_230->x,local_230->y,local_230[1].x,&local_178.x,&local_d8.x,
                 (float *)local_158);
      pIVar22 = local_238;
      this = local_1a8;
      if ((local_178.x <= 0.0) && (0.0 < local_26c)) {
        if (0.0 < (float)local_158._0_4_) {
LAB_00167dc1:
          if (0.0 < local_d8.x) goto LAB_00167de7;
          fVar43 = local_268 * 0.5;
        }
        else {
          if ((local_264 == (float)local_158._0_4_) &&
             (!NAN(local_264) && !NAN((float)local_158._0_4_))) goto LAB_00167dc1;
          local_158._0_4_ = local_264 * 0.5;
          fVar43 = local_268;
        }
        ColorConvertHSVtoRGB(local_26c,fVar43,(float)local_158._0_4_,&pIVar26->x,out_g,&out_b->x);
      }
    }
LAB_00167de7:
    iVar25 = local_218._0_4_;
    iVar30 = local_218._4_4_;
    iVar35 = (int)(float)uStack_210;
    iVar36 = (int)uStack_210._4_4_;
  }
  local_68 = (float)iVar25;
  fStack_64 = (float)iVar30;
  fStack_60 = (float)iVar35;
  fStack_5c = (float)iVar36;
  if (local_208[0] != '\0') {
    if ((uVar23 >> 0x1b & 1) == 0) {
      if ((uVar23 >> 0x1c & 1) != 0) {
        local_26c = pIVar26->x;
        local_268 = pIVar26->y;
        local_264 = pIVar26[1].x;
        ColorConvertHSVtoRGB(local_26c,local_268,local_264,&local_21c,&local_220,&local_224);
      }
    }
    else {
      local_21c = pIVar26->x;
      local_220 = pIVar26->y;
      local_224 = pIVar26[1].x;
      ColorConvertRGBtoHSV(local_21c,local_220,local_224,&local_26c,&local_268,&local_264);
      IVar4.x = pIVar22->ColorEditLastColor[0];
      IVar4.y = pIVar22->ColorEditLastColor[1];
      if (pIVar22->ColorEditLastColor[2] == pIVar26[1].x && IVar4 == *pIVar26) {
        if ((local_268 == 0.0) && (!NAN(local_268))) {
          local_26c = pIVar22->ColorEditLastHue;
        }
        if ((local_264 == 0.0) && (!NAN(local_264))) {
          local_268 = pIVar22->ColorEditLastSat;
        }
      }
    }
  }
  local_d8.w = (pIVar22->Style).Alpha;
  fVar43 = 1.0;
  if (local_d8.w <= 1.0) {
    fVar43 = local_d8.w;
  }
  iVar25 = (int)((float)(~-(uint)(local_d8.w < 0.0) & (uint)fVar43) * 255.0 + 0.5);
  local_d8.x = 1.0;
  local_d8.y = 1.0;
  local_d8.z = 1.0;
  uVar29 = iVar25 * 0x1000000;
  local_168 = uVar29 + 0xff0000;
  uVar16 = iVar25 << 0x18;
  local_160 = uVar16 | 0xff;
  fStack_170 = (float)(iVar25 << 0x18 | 0xff00);
  fStack_16c = (float)(iVar25 << 0x18 | 0xffff00);
  local_218 = (undefined1  [8])(CONCAT44(iVar25 << 0x18,uVar16) | 0xffff000000ff);
  uStack_210._0_4_ = fStack_170;
  uStack_210._4_4_ = fStack_16c;
  local_108._0_4_ = uVar29 + 0xffffff;
  local_178 = (ImVec2)(CONCAT44(iVar25 << 0x18,uVar16) | 0xffff000000ff);
  local_164 = uVar29 + 0xff00ff;
  local_13c = uVar29 + 0x808080;
  ColorConvertHSVtoRGB(local_26c,1.0,1.0,&local_d8.x,&local_d8.y,&local_d8.z);
  IVar17 = ColorConvertFloat4ToU32(&local_d8);
  local_158._4_4_ = local_220;
  local_158._0_4_ = local_21c;
  local_150.y = (pIVar22->Style).Alpha;
  local_150.x = local_224;
  IVar18 = ColorConvertFloat4ToU32((ImVec4 *)local_158);
  fVar43 = (float)local_218._0_4_;
  local_110.x = 0.0;
  local_110.y = 0.0;
  uVar15 = local_108._0_4_;
  if ((uVar23 >> 0x1a & 1) == 0) {
    if ((uVar23 >> 0x19 & 1) != 0) {
      local_158._4_4_ = local_1b8.y + local_1c8;
      local_158._0_4_ = local_88._0_4_;
      local_1e4 = IVar18;
      ImDrawList::AddRectFilledMultiColor
                ((ImDrawList *)this,&local_148,(ImVec2 *)local_158,local_108._0_4_,IVar17,IVar17,
                 local_108._0_4_);
      local_1a8._4_4_ = local_1c8;
      local_1a8._0_4_ = local_1c8;
      uStack_1a0._0_4_ = local_1c8;
      uStack_1a0._4_4_ = local_1c8;
      local_158._0_4_ = local_148.x + local_1c8;
      local_158._4_4_ = local_148.y + local_1c8;
      ImDrawList::AddRectFilledMultiColor
                ((ImDrawList *)this,&local_148,(ImVec2 *)local_158,0,0,uVar29,uVar29);
      p_max.x = (float)local_1a8._0_4_ + local_148.x;
      p_max.y = (float)local_1a8._4_4_ + local_148.y;
      RenderFrameBorder(local_148,p_max,0.0);
      auVar44._4_4_ = 1.0 - local_264;
      auVar44._0_4_ = local_268;
      auVar44._8_8_ = 0;
      auVar47 = minps(_DAT_0019c8f0,auVar44);
      fVar31 = local_148.x;
      fVar46 = local_148.y;
      auVar40._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_268) & auVar47._0_4_) * (float)local_1a8._0_4_
                        + fVar31 + 0.5);
      auVar40._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_264) & auVar47._4_4_) *
                        (float)local_1a8._4_4_ + fVar46 + 0.5);
      auVar40._8_4_ = (float)(int)(auVar47._8_4_ * (float)uStack_1a0 + 0.0 + 0.0);
      auVar40._12_4_ = (float)(int)(auVar47._12_4_ * uStack_1a0._4_4_ + 0.0 + 0.0);
      auVar45._0_4_ = (float)local_1a8._0_4_ + fVar31 + -2.0;
      auVar45._4_4_ = (float)local_1a8._4_4_ + fVar46 + -2.0;
      auVar45._8_4_ = (float)uStack_1a0 + 0.0 + 0.0;
      auVar45._12_4_ = uStack_1a0._4_4_ + 0.0 + 0.0;
      auVar47 = minps(auVar45,auVar40);
      uVar23 = -(uint)(auVar40._0_4_ < fVar31 + 2.0);
      uVar29 = -(uint)(auVar40._4_4_ < fVar46 + 2.0);
      local_110 = (ImVec2)(CONCAT44(~uVar29 & auVar47._4_4_,~uVar23 & auVar47._0_4_) |
                          CONCAT44((uint)(fVar46 + 2.0) & uVar29,(uint)(fVar31 + 2.0) & uVar23));
      local_1a8._4_4_ = fStack_1c4;
      local_1a8._0_4_ = local_1c8 / 6.0;
      uStack_1a0._0_4_ = (float)uStack_1c0;
      uStack_1a0._4_4_ = (float)uStack_1bc;
      lVar27 = 0;
      do {
        local_158._4_4_ = (float)(int)lVar27 * (float)local_1a8._0_4_ + local_148.y;
        local_158._0_4_ = local_258._0_4_;
        lVar1 = lVar27 + 1;
        local_118.y = (float)(int)lVar1 * (float)local_1a8._0_4_ + local_148.y;
        local_118.x = (float)local_248._0_4_;
        fVar31 = (&local_178.y)[lVar27];
        ImDrawList::AddRectFilledMultiColor
                  ((ImDrawList *)this,(ImVec2 *)local_158,&local_118,(ImU32)fVar43,(ImU32)fVar43,
                   (ImU32)fVar31,(ImU32)fVar31);
        lVar27 = lVar1;
        fVar43 = fVar31;
      } while (lVar1 != 6);
      _local_1a8 = ZEXT416((uint)(float)(int)(local_26c * local_1c8 + local_148.y + 0.5));
      p_min.y = local_148.y;
      p_min.x = (float)local_258._0_4_;
      p_max_00.y = local_1c8 + local_148.y;
      p_max_00.x = (float)local_248._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_258._0_4_ + -1.0;
      pos.y = (float)local_1a8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar
                ((ImDrawList *)this,pos,half_sz,local_188 + 2.0,(local_238->Style).Alpha);
      IVar18 = local_1e4;
    }
  }
  else {
    _local_88 = ZEXT416((uint)(0.5 / (float)local_98._0_4_));
    local_e8 = 5.60519e-45;
    if (4 < (int)(float)local_98._0_4_ / 0xc) {
      local_e8 = (float)((int)(float)local_98._0_4_ / 0xc);
    }
    local_c8._4_4_ = 0x80000000;
    local_c8._0_4_ = -(0.5 / (float)local_98._0_4_);
    local_c8._8_4_ = 0x80000000;
    local_c8._12_4_ = 0x80000000;
    local_98._0_4_ = (float)local_98._0_4_ + (float)local_b8._0_4_;
    local_1dc = (float)local_98._0_4_ * 0.5;
    local_b8._4_4_ = local_b8._0_4_;
    fStack_b0 = (float)local_b8._0_4_;
    fStack_ac = (float)local_b8._0_4_;
    lVar27 = 0;
    local_1e4 = IVar18;
    local_ec = IVar17;
    local_70 = (ulong)uVar29;
    do {
      fVar31 = (float)(int)lVar27 / 6.0;
      fVar31 = (fVar31 + fVar31) * 3.1415927 + (float)local_c8._0_4_;
      fVar46 = ((float)(int)lVar27 + 1.0) / 6.0;
      fVar46 = (fVar46 + fVar46) * 3.1415927 + (float)local_88._0_4_;
      local_1b8.x = fVar46;
      iVar25 = (((ImDrawList *)this)->VtxBuffer).Size;
      local_218._0_4_ = fVar31;
      ImDrawList::PathArcTo((ImDrawList *)this,&local_1f0,local_1dc,fVar31,fVar46,(int)local_e8);
      ImDrawList::AddPolyline
                ((ImDrawList *)this,(((ImDrawList *)this)->_Path).Data,
                 (((ImDrawList *)this)->_Path).Size,uVar15,false,local_25c);
      (((ImDrawList *)this)->_Path).Size = 0;
      iVar30 = *(int *)((long)local_1a8 + 0x20);
      _local_248 = ZEXT416((uint)local_1f0.x);
      local_258._0_4_ = cosf((float)local_218._0_4_);
      local_258._4_4_ = extraout_XMM0_Db_03;
      fStack_250 = (float)extraout_XMM0_Dc_03;
      fStack_24c = (float)extraout_XMM0_Dd_03;
      auVar41._4_4_ = local_1f0.y;
      auVar41._0_4_ = local_248._0_4_;
      auVar41._8_4_ = local_248._4_4_;
      auVar41._12_4_ = 0;
      _local_248 = auVar41;
      fVar31 = sinf((float)local_218._0_4_);
      fVar46 = (float)local_258._4_4_ * fStack_b0;
      local_258._4_4_ = fVar31 * (float)local_b8._4_4_ + (float)local_248._4_4_;
      local_258._0_4_ = (float)local_258._0_4_ * (float)local_b8._0_4_ + (float)local_248._0_4_;
      fStack_250 = fVar46 + fStack_240;
      fStack_24c = extraout_XMM0_Db_04 * fStack_ac + fStack_23c;
      _local_248 = ZEXT416((uint)local_1f0.x);
      local_218._0_4_ = cosf(local_1b8.x);
      local_218._4_4_ = extraout_XMM0_Db_05;
      uStack_210._0_4_ = (float)extraout_XMM0_Dc_04;
      uStack_210._4_4_ = (float)extraout_XMM0_Dd_04;
      auVar42._4_4_ = local_1f0.y;
      auVar42._0_4_ = local_248._0_4_;
      auVar42._8_4_ = local_248._4_4_;
      auVar42._12_4_ = 0;
      _local_248 = auVar42;
      fVar31 = sinf(local_1b8.x);
      gradient_p1.x = (float)local_218._0_4_ * (float)local_b8._0_4_ + (float)local_248._0_4_;
      gradient_p1.y = fVar31 * (float)local_b8._4_4_ + (float)local_248._4_4_;
      fVar31 = (&local_178.y)[lVar27];
      lVar27 = lVar27 + 1;
      this = local_1a8;
      ShadeVertsLinearColorGradientKeepAlpha
                ((ImDrawList *)local_1a8,iVar25,iVar30,(ImVec2)local_258,gradient_p1,(ImU32)fVar43,
                 (ImU32)fVar31);
      fVar43 = fVar31;
    } while (lVar27 != 6);
    local_258._0_4_ = cosf((local_26c + local_26c) * 3.1415927);
    local_258._4_4_ = extraout_XMM0_Db_06;
    fStack_250 = (float)extraout_XMM0_Dc_05;
    fStack_24c = (float)extraout_XMM0_Dd_05;
    local_248._0_4_ = sinf((local_26c + local_26c) * 3.1415927);
    IVar18 = local_ec;
    local_248._4_4_ = extraout_XMM0_Db_07;
    fStack_240 = (float)extraout_XMM0_Dc_06;
    fStack_23c = (float)extraout_XMM0_Dd_06;
    local_158._0_4_ = (float)local_258._0_4_ * (float)local_98._0_4_ * 0.5 + local_1f0.x;
    local_158._4_4_ = (float)local_248._0_4_ * (float)local_98._0_4_ * 0.5 + local_1f0.y;
    if ((char)local_260 == '\0') {
      fVar43 = 0.55;
    }
    else {
      fVar43 = 0.65;
    }
    uVar15 = local_108._0_4_;
    local_25c = local_25c * fVar43;
    iVar25 = 0x20;
    if ((int)(local_25c / 1.4) < 0x20) {
      iVar25 = (int)(local_25c / 1.4);
    }
    iVar30 = 9;
    if (9 < iVar25) {
      iVar30 = iVar25;
    }
    ImDrawList::AddCircleFilled((ImDrawList *)this,(ImVec2 *)local_158,local_25c,local_ec,iVar30);
    IVar17 = local_13c;
    ImDrawList::AddCircle
              ((ImDrawList *)this,(ImVec2 *)local_158,local_25c + 1.0,local_13c,iVar30,1.0);
    ImDrawList::AddCircle((ImDrawList *)this,(ImVec2 *)local_158,local_25c,uVar15,iVar30,1.0);
    uVar13 = local_248._0_4_;
    uVar14 = local_248._4_4_;
    uVar11 = local_258._0_4_;
    uVar12 = local_258._4_4_;
    fVar43 = (float)local_258._4_4_ * 0.0;
    fVar31 = (float)local_258._4_4_ * 0.0;
    local_1b8.x = local_1f0.x;
    local_118.x = local_1d0.x * (float)local_258._0_4_ + -local_1d0.y * (float)local_248._0_4_ +
                  local_1b8.x;
    local_1b8.y = local_1f0.y;
    local_118.y = local_1d0.x * (float)local_248._0_4_ + local_1d0.y * (float)local_258._0_4_ +
                  local_1b8.y;
    local_258._4_4_ = local_118.y;
    local_258._0_4_ = local_118.x;
    fStack_250 = (float)local_248._4_4_ * 0.0 + (float)local_248._4_4_ * -0.0 + 0.0;
    fStack_24c = fVar31 + fVar43 + 0.0;
    fVar43 = (float)local_248._4_4_ * -0.0;
    fVar46 = (float)local_248._4_4_ * 0.0;
    fVar31 = local_190.x * (float)uVar11 + -local_190.y * (float)local_248._0_4_ + local_1b8.x;
    local_248._4_4_ =
         local_190.x * (float)local_248._0_4_ + local_190.y * (float)uVar11 + local_1b8.y;
    local_248._0_4_ = fVar31;
    fStack_240 = fVar46 + fVar43 + 0.0;
    fStack_23c = (float)uVar12 * 0.0 + (float)uVar12 * 0.0 + 0.0;
    local_38.y = (float)local_248._4_4_;
    local_38.x = fVar31;
    local_1b8.x = local_1d8.x * (float)uVar11 + -local_1d8.y * (float)uVar13 + local_1b8.x;
    local_1b8.y = local_1d8.x * (float)uVar13 + local_1d8.y * (float)uVar11 + local_1b8.y;
    uStack_1b0 = CONCAT44((float)uVar12 * 0.0 + (float)uVar12 * 0.0 + 0.0,
                          (float)uVar14 * 0.0 + (float)uVar14 * -0.0 + 0.0);
    local_40.y = local_1b8.y;
    local_40.x = local_1b8.x;
    IVar32 = GetFontTexUvWhitePixel();
    uStack_210 = extraout_XMM0_Qb;
    local_218._0_4_ = IVar32.x;
    local_218._4_4_ = IVar32.y;
    ImDrawList::PrimReserve((ImDrawList *)this,6,6);
    auVar8 = _local_218;
    auVar34 = _local_248;
    auVar47 = _local_258;
    pIVar5 = *(ImDrawIdx **)((long)this + 0x58);
    *pIVar5 = (ImDrawIdx)*(uint *)((long)this + 0x48);
    *(ImDrawIdx **)((long)this + 0x58) = pIVar5 + 1;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    (pIVar6->pos).x = (float)local_258._0_4_;
    (pIVar6->pos).y = (float)local_258._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    (pIVar6->uv).x = (float)local_218._0_4_;
    (pIVar6->uv).y = (float)local_218._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    pIVar6->col = IVar18;
    *(ImDrawVert **)((long)this + 0x50) = pIVar6 + 1;
    uVar23 = *(uint *)((long)this + 0x48) + 1;
    *(uint *)((long)this + 0x48) = uVar23;
    pIVar5 = *(ImDrawIdx **)((long)this + 0x58);
    *pIVar5 = (ImDrawIdx)uVar23;
    *(ImDrawIdx **)((long)this + 0x58) = pIVar5 + 1;
    pIVar6[1].pos.x = (float)local_248._0_4_;
    pIVar6[1].pos.y = (float)local_248._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    (pIVar6->uv).x = (float)local_218._0_4_;
    (pIVar6->uv).y = (float)local_218._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    pIVar6->col = IVar18;
    *(ImDrawVert **)((long)this + 0x50) = pIVar6 + 1;
    uVar23 = *(uint *)((long)this + 0x48) + 1;
    *(uint *)((long)this + 0x48) = uVar23;
    pIVar5 = *(ImDrawIdx **)((long)this + 0x58);
    *pIVar5 = (ImDrawIdx)uVar23;
    *(ImDrawIdx **)((long)this + 0x58) = pIVar5 + 1;
    pIVar6[1].pos = local_1b8;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    (pIVar6->uv).x = (float)local_218._0_4_;
    (pIVar6->uv).y = (float)local_218._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    pIVar6->col = uVar15;
    *(ImDrawVert **)((long)this + 0x50) = pIVar6 + 1;
    uVar23 = *(uint *)((long)this + 0x48) + 1;
    *(uint *)((long)this + 0x48) = uVar23;
    pIVar5 = *(ImDrawIdx **)((long)this + 0x58);
    *pIVar5 = (ImDrawIdx)uVar23;
    *(ImDrawIdx **)((long)this + 0x58) = pIVar5 + 1;
    pIVar6[1].pos.x = (float)local_258._0_4_;
    pIVar6[1].pos.y = (float)local_258._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    (pIVar6->uv).x = (float)local_218._0_4_;
    (pIVar6->uv).y = (float)local_218._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    pIVar6->col = 0;
    *(ImDrawVert **)((long)this + 0x50) = pIVar6 + 1;
    uVar23 = *(uint *)((long)this + 0x48) + 1;
    *(uint *)((long)this + 0x48) = uVar23;
    pIVar5 = *(ImDrawIdx **)((long)this + 0x58);
    *pIVar5 = (ImDrawIdx)uVar23;
    *(ImDrawIdx **)((long)this + 0x58) = pIVar5 + 1;
    pIVar6[1].pos.x = (float)local_248._0_4_;
    pIVar6[1].pos.y = (float)local_248._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    (pIVar6->uv).x = (float)local_218._0_4_;
    (pIVar6->uv).y = (float)local_218._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    pIVar6->col = (ImU32)local_70;
    *(ImDrawVert **)((long)this + 0x50) = pIVar6 + 1;
    uVar23 = *(uint *)((long)this + 0x48) + 1;
    *(uint *)((long)this + 0x48) = uVar23;
    pIVar5 = *(ImDrawIdx **)((long)this + 0x58);
    *pIVar5 = (ImDrawIdx)uVar23;
    *(ImDrawIdx **)((long)this + 0x58) = pIVar5 + 1;
    pIVar6[1].pos = local_40;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    (pIVar6->uv).x = (float)local_218._0_4_;
    (pIVar6->uv).y = (float)local_218._4_4_;
    pIVar6 = *(ImDrawVert **)((long)this + 0x50);
    pIVar6->col = 0;
    *(ImDrawVert **)((long)this + 0x50) = pIVar6 + 1;
    *(uint *)((long)this + 0x48) = *(uint *)((long)this + 0x48) + 1;
    _local_258 = auVar47;
    _local_248 = auVar34;
    _local_218 = auVar8;
    ImDrawList::AddTriangle((ImDrawList *)this,&local_118,&local_38,&local_40,IVar17,1.5);
    fVar43 = 1.0;
    if (local_268 <= 1.0) {
      fVar43 = local_268;
    }
    fVar43 = (float)(~-(uint)(local_268 < 0.0) & (uint)fVar43);
    fVar46 = 1.0 - local_264;
    fVar31 = 1.0;
    if (fVar46 <= 1.0) {
      fVar31 = fVar46;
    }
    fVar31 = (float)(~-(uint)(fVar46 < 0.0) & (uint)fVar31);
    fVar46 = fVar43 * (local_118.x - local_40.x) + local_40.x;
    fVar43 = fVar43 * (local_118.y - local_40.y) + local_40.y;
    local_110.x = fVar31 * (local_38.x - fVar46) + fVar46;
    local_110.y = fVar31 * (local_38.y - fVar43) + fVar43;
    IVar18 = local_1e4;
  }
  pIVar2 = local_f8;
  pIVar26 = local_230;
  if (local_138[0] == '\0') {
    fVar43 = 6.0;
  }
  else {
    fVar43 = 10.0;
  }
  uVar15 = local_108._0_4_;
  local_258._0_4_ = fVar43;
  ImDrawList::AddCircleFilled((ImDrawList *)this,&local_110,fVar43,IVar18,0xc);
  ImDrawList::AddCircle
            ((ImDrawList *)this,&local_110,(float)local_258._0_4_ + 1.0,local_13c,0xc,1.0);
  ImDrawList::AddCircle((ImDrawList *)this,&local_110,(float)local_258._0_4_,uVar15,0xc,1.0);
  pIVar22 = local_238;
  if (local_1e0 == 0x10000) {
    fVar43 = pIVar26[1].y;
    _local_248 = ZEXT416((uint)fVar43);
    fVar31 = 1.0;
    if (fVar43 <= 1.0) {
      fVar31 = fVar43;
    }
    _local_258 = ZEXT416((uint)(1.0 - fVar31));
    local_158._4_4_ = local_148.y;
    local_158._0_4_ = local_128._0_4_;
    local_150.x = (float)local_128._0_4_ + local_188;
    local_150.y = local_148.y + local_1c8;
    RenderColorRectWithAlphaCheckerboard
              ((ImDrawList *)this,(ImVec2)local_158,local_150,0,
               (local_150.x - (float)local_128._0_4_) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              ((ImDrawList *)this,(ImVec2 *)local_158,&local_150,IVar18,IVar18,IVar18 & 0xffffff,
               IVar18 & 0xffffff);
    local_258._4_4_ = (float)(int)(float)(~local_248._4_4_ & local_258._4_4_);
    local_258._0_4_ =
         (float)(int)((float)(-(uint)((float)local_248._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_248._0_4_ < 0.0) & local_258._0_4_) * local_1c8 +
                      local_148.y + 0.5);
    fStack_250 = (float)(int)(float)(~(uint)fStack_240 & (uint)fStack_250);
    fStack_24c = (float)(int)(float)(~(uint)fStack_23c & (uint)fStack_24c);
    RenderFrameBorder((ImVec2)local_158,local_150,0.0);
    pos_00.x = (float)local_128._0_4_ + -1.0;
    pos_00.y = (float)local_258._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar
              ((ImDrawList *)this,pos_00,half_sz_00,local_188 + 2.0,(pIVar22->Style).Alpha);
  }
  EndGroup();
  uVar15 = local_208._0_4_;
  uVar23 = local_208._0_4_;
  if (local_208[0] != '\0') {
    iVar25 = bcmp(local_58,pIVar26,local_a0);
    uVar23 = uVar15 & 0xff;
    if (iVar25 == 0) {
      uVar23 = 0;
    }
  }
  bVar21 = (byte)uVar23;
  if ((uVar23 & 1) != 0) {
    MarkItemEdited((pIVar2->DC).LastItemId);
  }
  PopID();
LAB_00168b73:
  return (bool)(bVar21 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
        {
            if (S == 0)
                H = g.ColorEditLastHue;
            if (V == 0)
                S = g.ColorEditLastSat;
        }
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10 * 1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
            {
                if (S == 0)
                    H = g.ColorEditLastHue;
                if (V == 0)
                    S = g.ColorEditLastSat;
            }
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}